

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O0

_Bool trans_srli(DisasContext_conflict12 *ctx,arg_srli *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  TCGv_i64 t_00;
  TCGv_i64 t;
  TCGContext_conflict11 *tcg_ctx;
  arg_srli *a_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (a->shamt < 0x40) {
    if (a->rd != 0) {
      t_00 = tcg_temp_new_i64(tcg_ctx_00);
      gen_get_gpr(tcg_ctx_00,t_00,a->rs1);
      tcg_gen_shri_i64_riscv64(tcg_ctx_00,t_00,t_00,(long)a->shamt);
      gen_set_gpr(tcg_ctx_00,a->rd,t_00);
      tcg_temp_free_i64(tcg_ctx_00,t_00);
    }
    ctx_local._7_1_ = true;
  }
  else {
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

static bool trans_srli(DisasContext *ctx, arg_srli *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (a->shamt >= TARGET_LONG_BITS) {
        return false;
    }

    if (a->rd != 0) {
        TCGv t = tcg_temp_new(tcg_ctx);
        gen_get_gpr(tcg_ctx, t, a->rs1);

        tcg_gen_shri_tl(tcg_ctx, t, t, a->shamt);
        gen_set_gpr(tcg_ctx, a->rd, t);
        tcg_temp_free(tcg_ctx, t);
    } /* NOP otherwise */
    return true;
}